

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O0

void __thiscall QSettings::~QSettings(QSettings *this)

{
  QSettingsPrivate *pQVar1;
  undefined8 *in_RDI;
  QSettingsPrivate *d;
  QObject *in_stack_000000f8;
  
  *in_RDI = &PTR_metaObject_00bebfa8;
  pQVar1 = d_func((QSettings *)0x7b20f9);
  if ((pQVar1->pendingChanges & 1U) != 0) {
    (*(pQVar1->super_QObjectPrivate).super_QObjectData._vptr_QObjectData[10])();
  }
  QObject::~QObject(in_stack_000000f8);
  return;
}

Assistant:

QSettings::~QSettings()
{
    Q_D(QSettings);
    if (d->pendingChanges) {
        // Don't cause a failing flush() to std::terminate() the whole
        // application - dtors are implicitly noexcept!
        QT_TRY {
            d->flush();
        } QT_CATCH(...) {
        }
    }